

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::anon_unknown_5::IsInstalledProtoPath
          (anon_unknown_5 *this,string_view path)

{
  string_view pc;
  int iVar1;
  char *__name;
  AlphaNum *in_RCX;
  AlphaNum local_a8;
  anon_unknown_5 *local_78;
  char *local_70;
  AlphaNum local_68;
  undefined1 local_38 [8];
  string file_path;
  string_view path_local;
  
  local_70 = (char *)path._M_len;
  pc._M_str = local_70;
  pc._M_len = (size_t)this;
  local_78 = this;
  file_path.field_2._8_8_ = this;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_68,pc);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,"/google/protobuf/descriptor.proto");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_38,(lts_20250127 *)&local_68,&local_a8,in_RCX);
  __name = (char *)std::__cxx11::string::c_str();
  iVar1 = access(__name,0);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1 != -1;
}

Assistant:

bool IsInstalledProtoPath(absl::string_view path) {
  // Checking the descriptor.proto file should be good enough.
  std::string file_path =
      absl::StrCat(path, "/google/protobuf/descriptor.proto");
  return access(file_path.c_str(), F_OK) != -1;
}